

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::buildPipeline
          (ComputeCacheTestInstance *this,deUint32 ndx)

{
  VkPipelineLayout obj;
  VkPipeline obj_00;
  DeviceInterface *vk;
  VkDevice device;
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar1;
  VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Move<vk::Handle<(vk::HandleType)16>_> local_108;
  Move<vk::Handle<(vk::HandleType)18>_> local_e8;
  undefined1 local_c8 [24];
  VkAllocationCallbacks *pVStack_b0;
  void *local_a8;
  undefined8 local_a0;
  VkShaderModule local_98;
  char *local_90;
  VkSpecializationInfo *local_88;
  VkPipelineLayout local_80;
  VkPipeline local_78;
  deInt32 local_70;
  VkPipelineLayoutCreateInfo local_60;
  
  vk = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  local_60.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.setLayoutCount = 1;
  local_60.pSetLayouts = (VkDescriptorSetLayout *)(this->m_descriptorSetLayout + ndx);
  local_60.pushConstantRangeCount = 0;
  local_60.pPushConstantRanges = (VkPushConstantRange *)0x0;
  ::vk::createPipelineLayout(&local_108,vk,device,&local_60,(VkAllocationCallbacks *)0x0);
  local_c8._16_8_ = local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
  ;
  pVStack_b0 = local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_c8._0_8_ = local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal
  ;
  local_c8._8_8_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal = 0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = this->m_pipelineLayout + ndx;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&this->m_pipelineLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj);
  }
  this->m_pipelineLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device
       = (VkDevice)local_c8._16_8_;
  this->m_pipelineLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_allocator = pVStack_b0;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = local_c8._0_8_
  ;
  this->m_pipelineLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_c8._8_8_;
  if (local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  local_98.m_internal =
       (this->m_computeShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_c8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_c8._8_8_ = (void *)0x0;
  local_c8._16_8_ = local_c8._16_8_ & 0xffffffff00000000;
  pVStack_b0 = (VkAllocationCallbacks *)
               CONCAT44(pVStack_b0._4_4_,VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO);
  local_a8 = (void *)0x0;
  local_a0._0_4_ = 0;
  local_a0._4_4_ = VK_SHADER_STAGE_COMPUTE_BIT;
  local_90 = "main";
  local_88 = (VkSpecializationInfo *)0x0;
  local_80.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
  local_78.m_internal = 0;
  local_70 = 0;
  ::vk::createComputePipeline
            (&local_e8,vk,device,
             (VkPipelineCache)
             (this->super_CacheTestInstance).m_cache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
             m_data.object.m_internal,(VkComputePipelineCreateInfo *)local_c8,
             (VkAllocationCallbacks *)0x0);
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       this->m_pipeline[ndx].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&this->m_pipeline[ndx].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_00);
  }
  this->m_pipeline[ndx].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  this->m_pipeline[ndx].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  this->m_pipeline[ndx].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  this->m_pipeline[ndx].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
       = local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void ComputeCacheTestInstance::buildPipeline (deUint32 ndx)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create compute pipeline layout
	const VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,  // VkStructureType                 sType;
		DE_NULL,                                        // const void*                     pNext;
		0u,                                             // VkPipelineLayoutCreateFlags     flags;
		1u,                                             // deUint32                        setLayoutCount;
		&m_descriptorSetLayout[ndx].get(),              // const VkDescriptorSetLayout*    pSetLayouts;
		0u,                                             // deUint32                        pushConstantRangeCount;
		DE_NULL,                                        // const VkPushConstantRange*      pPushConstantRanges;
	};

	m_pipelineLayout[ndx] = createPipelineLayout(vk, vkDevice, &pipelineLayoutCreateInfo);

	const VkPipelineShaderStageCreateInfo stageCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO, // VkStructureType                     sType;
		DE_NULL,                                             // const void*                         pNext;
		0u,                                                  // VkPipelineShaderStageCreateFlags    flags;
		VK_SHADER_STAGE_COMPUTE_BIT,                         // VkShaderStageFlagBits               stage;
		*m_computeShaderModule,                              // VkShaderModule                      module;
		"main",                                              // const char*                         pName;
		DE_NULL,                                             // const VkSpecializationInfo*         pSpecializationInfo;
	};

	const VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,      // VkStructureType                 sType;
		DE_NULL,                                             // const void*                     pNext;
		0u,                                                  // VkPipelineCreateFlags           flags;
		stageCreateInfo,                                     // VkPipelineShaderStageCreateInfo stage;
		*m_pipelineLayout[ndx],                              // VkPipelineLayout                layout;
		(VkPipeline)0,                                       // VkPipeline                      basePipelineHandle;
		0u,                                                  // deInt32                         basePipelineIndex;
	};

	m_pipeline[ndx] = createComputePipeline(vk, vkDevice, *m_cache, &pipelineCreateInfo);
}